

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyObj.c
# Opt level: O2

Ivy_Obj_t * Ivy_ObjCreate(Ivy_Man_t *p,Ivy_Obj_t *pGhost)

{
  uint *puVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Vec_Int_t *pVVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Ivy_Obj_t *pIVar8;
  ulong uVar9;
  Ivy_Man_t *pIVar10;
  int *piVar11;
  ulong uVar13;
  int iVar14;
  char *__assertion;
  int iVar15;
  long lVar16;
  uint uVar17;
  long lVar12;
  
  if (((ulong)pGhost & 1) != 0) {
    __assertion = "!Ivy_IsComplement(pGhost)";
    uVar17 = 0x50;
LAB_005f5a9f:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyObj.c"
                  ,uVar17,"Ivy_Obj_t *Ivy_ObjCreate(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (-1 < pGhost->Id) {
    __assertion = "Ivy_ObjIsGhost(pGhost)";
    uVar17 = 0x51;
    goto LAB_005f5a9f;
  }
  pIVar8 = Ivy_TableLookup(p,pGhost);
  if (pIVar8 != (Ivy_Obj_t *)0x0) {
    __assertion = "Ivy_TableLookup(p, pGhost) == NULL";
    uVar17 = 0x52;
    goto LAB_005f5a9f;
  }
  pIVar8 = p->pListFree;
  if (pIVar8 == (Ivy_Obj_t *)0x0) {
    Ivy_ManAddMemory(p);
    pIVar8 = p->pListFree;
  }
  p->pListFree = *(Ivy_Obj_t **)pIVar8;
  pIVar8->pPrevFan1 = (Ivy_Obj_t *)0x0;
  pIVar8->pEquiv = (Ivy_Obj_t *)0x0;
  pIVar8->pNextFan1 = (Ivy_Obj_t *)0x0;
  pIVar8->pPrevFan0 = (Ivy_Obj_t *)0x0;
  pIVar8->pFanout = (Ivy_Obj_t *)0x0;
  pIVar8->pNextFan0 = (Ivy_Obj_t *)0x0;
  pIVar8->pFanin0 = (Ivy_Obj_t *)0x0;
  pIVar8->pFanin1 = (Ivy_Obj_t *)0x0;
  pIVar8->Id = 0;
  pIVar8->TravId = 0;
  *(undefined8 *)&pIVar8->field_0x8 = 0;
  p_00 = p->vObjs;
  pIVar8->Id = p_00->nSize;
  Vec_PtrPush(p_00,pIVar8);
  uVar5 = *(uint *)&pGhost->field_0x8 & 0xf;
  uVar17 = *(uint *)&pIVar8->field_0x8;
  *(uint *)&pIVar8->field_0x8 = uVar17 & 0xfffffff0 | uVar5;
  *(uint *)&pIVar8->field_0x8 = uVar17 & 0xfffff9f0 | uVar5 | *(uint *)&pGhost->field_0x8 & 0x600;
  Ivy_ObjConnect(p,pIVar8,pGhost->pFanin0,pGhost->pFanin1);
  uVar17 = *(uint *)&pIVar8->field_0x8;
  uVar5 = uVar17 & 0xf;
  if (0xfffffffd < uVar5 - 7) {
    uVar9 = (ulong)pIVar8->pFanin0 & 0xfffffffffffffffe;
    uVar13 = (ulong)pIVar8->pFanin1 & 0xfffffffffffffffe;
    if (*(uint *)(uVar13 + 8) >> 0xb < *(uint *)(uVar9 + 8) >> 0xb) {
      uVar13 = uVar9;
    }
    uVar17 = uVar17 & 0x7ff | *(int *)(uVar13 + 8) + (uint)(uVar5 == 6) * 0x800 + 0x800 & 0xfffff800
    ;
    goto LAB_005f58b9;
  }
  switch(uVar5) {
  case 1:
    goto switchD_005f5855_caseD_1;
  case 2:
  case 3:
  case 7:
    uVar17 = uVar17 & 0x7ff |
             *(uint *)(((ulong)pIVar8->pFanin0 & 0xfffffffffffffffe) + 8) & 0xfffff800;
    break;
  case 4:
    uVar17 = uVar17 & 0x7f4;
    break;
  default:
    __assertion = "0";
    uVar17 = 0x65;
    goto LAB_005f5a9f;
  }
LAB_005f58b9:
  *(uint *)&pIVar8->field_0x8 = uVar17;
switchD_005f5855_caseD_1:
  uVar5 = uVar17 & 0xf;
  if (uVar5 - 7 < 0xfffffffe) {
    if ((uVar5 < 8) && ((0x9cU >> uVar5 & 1) != 0)) {
      uVar6 = Ivy_ObjFaninPhase(pIVar8->pFanin0);
      goto LAB_005f58fb;
    }
  }
  else {
    uVar5 = Ivy_ObjFaninPhase(pIVar8->pFanin0);
    uVar6 = Ivy_ObjFaninPhase(pIVar8->pFanin1);
    uVar6 = uVar6 & uVar5;
LAB_005f58fb:
    uVar17 = uVar17 & 0xffffff7f | uVar6 << 7;
    *(uint *)&pIVar8->field_0x8 = uVar17;
  }
  if (0xfffffffd < (uVar17 & 0xf) - 7) {
    uVar17 = uVar17 & 0xfffffeff |
             (*(uint *)(((ulong)pIVar8->pFanin1 & 0xfffffffffffffffe) + 8) |
             *(uint *)(((ulong)pIVar8->pFanin0 & 0xfffffffffffffffe) + 8)) & 0x100;
    *(uint *)&pIVar8->field_0x8 = uVar17;
  }
  if ((uVar17 & 0xf) == 6) {
    puVar1 = (uint *)(((ulong)pIVar8->pFanin0 & 0xfffffffffffffffe) + 8);
    *puVar1 = *puVar1 | 0x40;
    puVar1 = (uint *)(((ulong)pIVar8->pFanin1 & 0xfffffffffffffffe) + 8);
    *puVar1 = *puVar1 | 0x40;
    uVar17 = *(uint *)&pIVar8->field_0x8;
  }
  pIVar10 = p;
  if ((uVar17 & 0xf) != 1) {
    if ((uVar17 & 0xf) != 2) goto LAB_005f598d;
    pIVar10 = (Ivy_Man_t *)&p->vPos;
  }
  Vec_PtrPush(pIVar10->vPis,pIVar8);
LAB_005f598d:
  pVVar3 = p->vRequired;
  if ((pVVar3 != (Vec_Int_t *)0x0) && (iVar7 = pVVar3->nSize, iVar7 <= pIVar8->Id)) {
    lVar16 = (long)iVar7;
    lVar4 = lVar16 * 2;
    iVar15 = (int)lVar4;
    if (iVar7 < iVar15) {
      iVar2 = pVVar3->nCap;
      iVar14 = iVar15;
      if (((iVar2 * 2 < iVar15) || (iVar14 = iVar2 * 2, iVar2 < iVar15)) && (iVar2 < iVar14)) {
        if (pVVar3->pArray == (int *)0x0) {
          piVar11 = (int *)malloc((long)iVar14 << 2);
        }
        else {
          piVar11 = (int *)realloc(pVVar3->pArray,(long)iVar14 << 2);
        }
        pVVar3->pArray = piVar11;
        if (piVar11 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar3->nCap = iVar14;
        iVar7 = pVVar3->nSize;
      }
      for (lVar12 = (long)iVar7; SBORROW8(lVar12,lVar4) != lVar12 + lVar16 * -2 < 0;
          lVar12 = lVar12 + 1) {
        pVVar3->pArray[lVar12] = 1000000;
      }
      pVVar3->nSize = iVar15;
    }
  }
  p->nObjs[*(uint *)&pIVar8->field_0x8 & 0xf] = p->nObjs[*(uint *)&pIVar8->field_0x8 & 0xf] + 1;
  p->nCreated = p->nCreated + 1;
  if (p->pHaig != (Ivy_Man_t *)0x0) {
    Ivy_ManHaigCreateObj(p,pIVar8);
  }
  return pIVar8;
}

Assistant:

Ivy_Obj_t * Ivy_ObjCreate( Ivy_Man_t * p, Ivy_Obj_t * pGhost )
{
    Ivy_Obj_t * pObj;
    assert( !Ivy_IsComplement(pGhost) );
    assert( Ivy_ObjIsGhost(pGhost) );
    assert( Ivy_TableLookup(p, pGhost) == NULL );
    // get memory for the new object
    pObj = Ivy_ManFetchMemory( p );
    assert( Ivy_ObjIsNone(pObj) );
    pObj->Id = Vec_PtrSize(p->vObjs);
    Vec_PtrPush( p->vObjs, pObj );
    // add basic info (fanins, compls, type, init)
    pObj->Type = pGhost->Type;
    pObj->Init = pGhost->Init;
    // add connections
    Ivy_ObjConnect( p, pObj, pGhost->pFanin0, pGhost->pFanin1 );
    // compute level
    if ( Ivy_ObjIsNode(pObj) )
        pObj->Level = Ivy_ObjLevelNew(pObj);
    else if ( Ivy_ObjIsLatch(pObj) )
        pObj->Level = 0;
    else if ( Ivy_ObjIsOneFanin(pObj) )
        pObj->Level = Ivy_ObjFanin0(pObj)->Level;
    else if ( !Ivy_ObjIsPi(pObj) )
        assert( 0 );
    // create phase
    if ( Ivy_ObjIsNode(pObj) )
        pObj->fPhase = Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj)) & Ivy_ObjFaninPhase(Ivy_ObjChild1(pObj));
    else if ( Ivy_ObjIsOneFanin(pObj) )
        pObj->fPhase = Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj));
    // set the fail TFO flag
    if ( Ivy_ObjIsNode(pObj) )
        pObj->fFailTfo = Ivy_ObjFanin0(pObj)->fFailTfo | Ivy_ObjFanin1(pObj)->fFailTfo;
    // mark the fanins in a special way if the node is EXOR
    if ( Ivy_ObjIsExor(pObj) )
    {
        Ivy_ObjFanin0(pObj)->fExFan = 1;
        Ivy_ObjFanin1(pObj)->fExFan = 1;
    }
    // add PIs/POs to the arrays
    if ( Ivy_ObjIsPi(pObj) )
        Vec_PtrPush( p->vPis, pObj );
    else if ( Ivy_ObjIsPo(pObj) )
        Vec_PtrPush( p->vPos, pObj );
//    else if ( Ivy_ObjIsBuf(pObj) )
//        Vec_PtrPush( p->vBufs, pObj );
    if ( p->vRequired && Vec_IntSize(p->vRequired) <= pObj->Id )
        Vec_IntFillExtra( p->vRequired, 2 * Vec_IntSize(p->vRequired), 1000000 );
    // update node counters of the manager
    p->nObjs[Ivy_ObjType(pObj)]++;
    p->nCreated++;

//    printf( "Adding %sAIG node: ", p->pHaig==NULL? "H":" " );
//    Ivy_ObjPrintVerbose( p, pObj, p->pHaig==NULL );
//    printf( "\n" );

    // if HAIG is defined, create a corresponding node
    if ( p->pHaig )
        Ivy_ManHaigCreateObj( p, pObj );
    return pObj;
}